

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u8 uVar1;
  u8 *puVar2;
  u16 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  u8 *puVar13;
  int x;
  u8 *pAddr_1;
  uint local_80;
  int top;
  int sz;
  int sz2;
  u8 *pAddr;
  u8 *pEnd;
  int iFree2;
  int iFree;
  int iCellLast;
  int iCellFirst;
  uchar *src;
  uchar *temp;
  uchar *data;
  uint local_38;
  int nCell;
  int cbrk;
  int cellOffset;
  int usableSize;
  int size;
  int hdr;
  int pc;
  int i;
  int nMaxFrag_local;
  MemPage *pPage_local;
  
  src = (uchar *)0x0;
  puVar2 = pPage->aData;
  uVar4 = (uint)pPage->hdrOffset;
  uVar5 = (uint)pPage->cellOffset;
  uVar6 = (uint)pPage->nCell;
  uVar7 = uVar5 + uVar6 * 2;
  uVar12 = pPage->pBt->usableSize;
  if ((int)(uint)puVar2[(int)(uVar4 + 7)] <= nMaxFrag) {
    uVar8 = (uint)CONCAT11(puVar2[(int)(uVar4 + 1)],puVar2[(long)(int)(uVar4 + 1) + 1]);
    if ((int)(uVar12 - 4) < (int)uVar8) {
      iVar9 = sqlite3CorruptError(0xfc73);
      return iVar9;
    }
    if (uVar8 != 0) {
      uVar10 = (uint)CONCAT11(puVar2[(int)uVar8],puVar2[(long)(int)uVar8 + 1]);
      if ((int)(uVar12 - 4) < (int)uVar10) {
        iVar9 = sqlite3CorruptError(0xfc76);
        return iVar9;
      }
      if ((uVar10 == 0) || ((puVar2[(int)uVar10] == '\0' && (puVar2[(int)(uVar10 + 1)] == '\0')))) {
        top = 0;
        local_80 = (uint)CONCAT11(puVar2[(int)(uVar8 + 2)],puVar2[(long)(int)(uVar8 + 2) + 1]);
        uVar11 = (uint)CONCAT11(puVar2[(int)(uVar4 + 5)],puVar2[(long)(int)(uVar4 + 5) + 1]);
        if (uVar8 <= uVar11) {
          iVar9 = sqlite3CorruptError(0xfc7e);
          return iVar9;
        }
        if (uVar10 == 0) {
          if ((int)uVar12 < (int)(uVar8 + local_80)) {
            iVar9 = sqlite3CorruptError(0xfc87);
            return iVar9;
          }
        }
        else {
          if (uVar10 < uVar8 + local_80) {
            iVar9 = sqlite3CorruptError(0xfc81);
            return iVar9;
          }
          top = (int)CONCAT11(puVar2[(int)(uVar10 + 2)],puVar2[(long)(int)(uVar10 + 2) + 1]);
          if ((int)uVar12 < (int)(uVar10 + top)) {
            iVar9 = sqlite3CorruptError(0xfc83);
            return iVar9;
          }
          memmove(puVar2 + (int)(uVar8 + local_80 + top),puVar2 + (int)(uVar8 + local_80),
                  (long)(int)(uVar10 - (uVar8 + local_80)));
          local_80 = top + local_80;
        }
        local_38 = uVar11 + local_80;
        memmove(puVar2 + (int)local_38,puVar2 + (int)uVar11,(long)(int)(uVar8 - uVar11));
        for (_sz = puVar2 + (int)uVar5; _sz < puVar2 + (int)(uVar5 + uVar6 * 2); _sz = _sz + 2) {
          uVar1 = _sz[1];
          uVar12 = (uint)CONCAT11(*_sz,uVar1);
          if (uVar12 < uVar8) {
            *_sz = (u8)(uVar12 + local_80 >> 8);
            _sz[1] = uVar1 + (char)local_80;
          }
          else if (uVar12 < uVar10) {
            *_sz = (u8)(uVar12 + top >> 8);
            _sz[1] = uVar1 + (char)top;
          }
        }
        goto LAB_0016758e;
      }
    }
  }
  _iCellLast = puVar2;
  local_38 = uVar12;
  for (hdr = 0; hdr < (int)uVar6; hdr = hdr + 1) {
    puVar13 = puVar2 + (int)(uVar5 + hdr * 2);
    uVar8 = (uint)CONCAT11(*puVar13,puVar13[1]);
    if ((uVar8 < uVar7) || ((int)(uVar12 - 4) < (int)uVar8)) {
      iVar9 = sqlite3CorruptError(0xfca3);
      return iVar9;
    }
    uVar3 = (*pPage->xCellSize)(pPage,_iCellLast + (int)uVar8);
    uVar10 = (uint)uVar3;
    local_38 = local_38 - uVar10;
    if (((int)local_38 < (int)uVar7) || ((int)uVar12 < (int)(uVar8 + uVar10))) {
      iVar9 = sqlite3CorruptError(0xfca9);
      return iVar9;
    }
    *puVar13 = (u8)(local_38 >> 8);
    puVar13[1] = (u8)local_38;
    if (src == (uchar *)0x0) {
      if (local_38 != uVar8) {
        _iCellLast = (u8 *)sqlite3PagerTempSpace(pPage->pBt->pPager);
        uVar11 = (uint)CONCAT11(puVar2[(int)(uVar4 + 5)],puVar2[(long)(int)(uVar4 + 5) + 1]);
        memcpy(_iCellLast + (int)uVar11,puVar2 + (int)uVar11,
               (long)(int)((local_38 + uVar10) - uVar11));
        src = _iCellLast;
        goto LAB_00167550;
      }
    }
    else {
LAB_00167550:
      memcpy(puVar2 + (int)local_38,_iCellLast + (int)uVar8,(long)(int)uVar10);
    }
  }
  puVar2[(int)(uVar4 + 7)] = '\0';
LAB_0016758e:
  if ((puVar2[(int)(uVar4 + 7)] + local_38) - uVar7 == pPage->nFree) {
    puVar2[(int)(uVar4 + 5)] = (u8)(local_38 >> 8);
    puVar2[(long)(int)(uVar4 + 5) + 1] = (u8)local_38;
    puVar2[(int)(uVar4 + 1)] = '\0';
    puVar2[(int)(uVar4 + 2)] = '\0';
    memset(puVar2 + (int)uVar7,0,(long)(int)(local_38 - uVar7));
    pPage_local._4_4_ = 0;
  }
  else {
    pPage_local._4_4_ = sqlite3CorruptError(0xfcbe);
  }
  return pPage_local._4_4_;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}